

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BigPropertyIndex __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetPropertyIndex_EnumerateTTD
          (DictionaryTypeHandlerBase<unsigned_short> *this,PropertyRecord *pRecord)

{
  int iVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  PropertyRecord **ppPVar2;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar3;
  BigPropertyIndex index;
  int index_00;
  
  index_00 = 0;
  while( true ) {
    this_00 = (this->propertyMap).ptr;
    if (this_00->count - this_00->freeCount <= index_00) {
      TTDAbort_unrecoverable_error("We found this and not accessor but NoBigSlot for index?");
    }
    ppPVar2 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetKeyAt(this_00,index_00);
    iVar1 = (*ppPVar2)->pid;
    pDVar3 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt((this->propertyMap).ptr,index_00);
    if ((iVar1 == pRecord->pid) && ((pDVar3->Attributes & 8) == 0)) break;
    index_00 = index_00 + 1;
  }
  return index_00;
}

Assistant:

Js::BigPropertyIndex DictionaryTypeHandlerBase<T>::GetPropertyIndex_EnumerateTTD(const Js::PropertyRecord* pRecord)
    {
        for (Js::BigPropertyIndex index = 0; index < this->propertyMap->Count(); index++)
        {
            Js::PropertyId pid = this->propertyMap->GetKeyAt(index)->GetPropertyId();
            const DictionaryPropertyDescriptor<T>& idescriptor = propertyMap->GetValueAt(index);

            if (pid == pRecord->GetPropertyId() && !(idescriptor.Attributes & PropertyDeleted))
            {
                return index;
            }
        }

        TTDAssert(false, "We found this and not accessor but NoBigSlot for index?");
        return Js::Constants::NoBigSlot;
    }